

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall JetHead::Socket::setConnected(Socket *this,bool state,int flags)

{
  Selector *this_00;
  
  if (this->mConnected != state) {
    this->mConnected = state;
    this_00 = this->mSelector;
    if ((this_00 != (Selector *)0x0) && (this->mListener != (SocketListener *)0x0)) {
      if (state) {
        Selector::addListener(this_00,this->mFd,(short)flags,&this->super_SelectorListener,0);
        return;
      }
      Selector::removeListener(this_00,this->mFd,&this->super_SelectorListener);
      return;
    }
  }
  return;
}

Assistant:

void Socket::setConnected( bool state, int flags )
{
	LOG_INFO( "Connected %d sel %p", state, mSelector );
	
	// if we are already in this state do nothing.
	if ( mConnected == state )
		return;
	
	mConnected = state;
	if ( mSelector != NULL and mListener != NULL )
	{
		if ( mConnected )
			mSelector->addListener( mFd, flags, this );
		else
			mSelector->removeListener( mFd, this );
	}
}